

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::Attribute::set_value<tinyusdz::value::ValueBlock>(Attribute *this,ValueBlock *v)

{
  storage_union local_38;
  vtable_type *local_28 [2];
  
  if ((this->_type_name)._M_string_length == 0) {
    local_38._8_8_ = 4;
    local_28[0] = (vtable_type *)CONCAT35(local_28[0]._5_3_,0x656e6f4e);
    local_38.dynamic = local_28;
    ::std::__cxx11::string::operator=((string *)&this->_type_name,(string *)&local_38);
    if ((vtable_type **)local_38.dynamic != local_28) {
      operator_delete(local_38.dynamic,(ulong)((long)&local_28[0]->type_id + 1));
    }
  }
  local_28[0] = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::ValueBlock>()::table;
  linb::any::swap((any *)&local_38,(any *)&this->_var);
  if (local_28[0] != (vtable_type *)0x0) {
    (*local_28[0]->destroy)(&local_38);
  }
  return;
}

Assistant:

void set_value(const T &v) {
    if (_type_name.empty()) {
      _type_name = value::TypeTraits<T>::type_name();
    }
    _var.set_value(v);
  }